

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

size_t bitset_extract_setbits_avx2
                 (uint64_t *words,size_t length,uint32_t *out,size_t outcapacity,uint32_t base)

{
  byte bVar1;
  byte bVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  byte bVar8;
  uint uVar9;
  int iVar10;
  int *piVar11;
  long in_RCX;
  int *in_RDX;
  ulong in_RSI;
  long in_RDI;
  int in_R8D;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  uint32_t val;
  int r;
  uint64_t w_1;
  uint8_t advanceB;
  uint8_t advanceA;
  __m256i vecB;
  __m256i vecA;
  uint8_t byteB;
  uint8_t byteA;
  int k;
  uint64_t w;
  size_t i;
  uint32_t *safeout;
  __m256i add8;
  __m256i incVec;
  __m256i baseVec;
  uint32_t *initout;
  unsigned_long_long local_728;
  undefined8 local_5a0;
  undefined8 uStack_598;
  undefined8 uStack_590;
  undefined8 uStack_588;
  int local_564;
  ulong local_518;
  ulong local_510;
  undefined8 uStack_4f0;
  undefined8 uStack_4e8;
  undefined1 local_4c0 [32];
  int local_484;
  int *local_478;
  undefined8 uStack_f0;
  undefined8 uStack_e8;
  undefined8 uStack_b0;
  undefined8 uStack_a8;
  
  uVar9 = in_R8D - 1;
  auVar3 = vpinsrd_avx(ZEXT416(uVar9),uVar9,1);
  auVar3 = vpinsrd_avx(auVar3,uVar9,2);
  local_4c0._0_16_ = vpinsrd_avx(auVar3,uVar9,3);
  auVar3 = vpinsrd_avx(ZEXT416(uVar9),uVar9,1);
  auVar3 = vpinsrd_avx(auVar3,uVar9,2);
  auVar3 = vpinsrd_avx(auVar3,uVar9,3);
  uStack_f0 = auVar3._0_8_;
  uStack_e8 = auVar3._8_8_;
  local_4c0._16_8_ = uStack_f0;
  local_4c0._24_8_ = uStack_e8;
  auVar3 = vpinsrd_avx(ZEXT416(0x40),0x40,1);
  auVar3 = vpinsrd_avx(auVar3,0x40,2);
  auVar3 = vpinsrd_avx(auVar3,0x40,3);
  auVar13 = vpinsrd_avx(ZEXT416(0x40),0x40,1);
  auVar13 = vpinsrd_avx(auVar13,0x40,2);
  auVar13 = vpinsrd_avx(auVar13,0x40,3);
  uStack_b0 = auVar13._0_8_;
  uStack_a8 = auVar13._8_8_;
  auVar13 = vpinsrd_avx(ZEXT416(8),8,1);
  auVar13 = vpinsrd_avx(auVar13,8,2);
  auVar13 = vpinsrd_avx(auVar13,8,3);
  auVar12 = vpinsrd_avx(ZEXT416(8),8,1);
  auVar12 = vpinsrd_avx(auVar12,8,2);
  auVar12 = vpinsrd_avx(auVar12,8,3);
  auVar12 = ZEXT116(0) * auVar13 + ZEXT116(1) * auVar12;
  auVar13 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar13;
  piVar11 = in_RDX + in_RCX;
  local_478 = in_RDX;
  for (local_510 = 0; local_510 < in_RSI && local_478 + 0x40 <= piVar11; local_510 = local_510 + 1)
  {
    local_518 = *(ulong *)(in_RDI + local_510 * 8);
    if (local_518 == 0) {
      auVar4._16_8_ = uStack_b0;
      auVar4._0_16_ = auVar3;
      auVar4._24_8_ = uStack_a8;
      local_4c0 = vpaddd_avx2(local_4c0,auVar4);
    }
    else {
      for (local_564 = 0; local_564 < 4; local_564 = local_564 + 1) {
        bVar8 = (byte)(local_518 >> 8);
        bVar1 = lengthTable[local_518 & 0xff];
        bVar2 = lengthTable[bVar8];
        auVar4 = vpaddd_avx2(local_4c0,(undefined1  [32])vecDecodeTable[local_518 & 0xff]);
        uStack_4f0 = auVar13._0_8_;
        uStack_4e8 = auVar13._8_8_;
        auVar5._16_8_ = uStack_4f0;
        auVar5._0_16_ = auVar12;
        auVar5._24_8_ = uStack_4e8;
        auVar5 = vpaddd_avx2(local_4c0,auVar5);
        auVar6 = vpaddd_avx2(auVar5,(undefined1  [32])vecDecodeTable[bVar8]);
        auVar7._16_8_ = uStack_4f0;
        auVar7._0_16_ = auVar12;
        auVar7._24_8_ = uStack_4e8;
        local_4c0 = vpaddd_avx2(auVar5,auVar7);
        local_5a0 = auVar4._0_8_;
        uStack_598 = auVar4._8_8_;
        uStack_590 = auVar4._16_8_;
        uStack_588 = auVar4._24_8_;
        *(undefined8 *)local_478 = local_5a0;
        *(undefined8 *)(local_478 + 2) = uStack_598;
        *(undefined8 *)(local_478 + 4) = uStack_590;
        *(undefined8 *)(local_478 + 6) = uStack_588;
        *(undefined1 (*) [32])(local_478 + (int)(uint)bVar1) = auVar6;
        local_478 = (int *)(*(undefined1 (*) [32])(local_478 + (int)(uint)bVar1) +
                           (long)(int)(uint)bVar2 * 4);
        local_518 = local_518 >> 0x10;
      }
    }
  }
  local_484 = in_R8D + (int)local_510 * 0x40;
  for (; local_510 < in_RSI && local_478 < piVar11; local_510 = local_510 + 1) {
    for (local_728 = *(unsigned_long_long *)(in_RDI + local_510 * 8);
        local_728 != 0 && local_478 < piVar11; local_728 = local_728 - 1 & local_728) {
      iVar10 = roaring_trailing_zeroes(local_728);
      *local_478 = iVar10 + local_484;
      local_478 = local_478 + 1;
    }
    local_484 = local_484 + 0x40;
  }
  return (long)local_478 - (long)in_RDX >> 2;
}

Assistant:

CROARING_TARGET_AVX2
size_t bitset_extract_setbits_avx2(const uint64_t *words, size_t length,
                                   uint32_t *out, size_t outcapacity,
                                   uint32_t base) {
    uint32_t *initout = out;
    __m256i baseVec = _mm256_set1_epi32(base - 1);
    __m256i incVec = _mm256_set1_epi32(64);
    __m256i add8 = _mm256_set1_epi32(8);
    uint32_t *safeout = out + outcapacity;
    size_t i = 0;
    for (; (i < length) && (out + 64 <= safeout); ++i) {
        uint64_t w = words[i];
        if (w == 0) {
            baseVec = _mm256_add_epi32(baseVec, incVec);
        } else {
            for (int k = 0; k < 4; ++k) {
                uint8_t byteA = (uint8_t)w;
                uint8_t byteB = (uint8_t)(w >> 8);
                w >>= 16;
                __m256i vecA =
                    _mm256_loadu_si256((const __m256i *)vecDecodeTable[byteA]);
                __m256i vecB =
                    _mm256_loadu_si256((const __m256i *)vecDecodeTable[byteB]);
                uint8_t advanceA = lengthTable[byteA];
                uint8_t advanceB = lengthTable[byteB];
                vecA = _mm256_add_epi32(baseVec, vecA);
                baseVec = _mm256_add_epi32(baseVec, add8);
                vecB = _mm256_add_epi32(baseVec, vecB);
                baseVec = _mm256_add_epi32(baseVec, add8);
                _mm256_storeu_si256((__m256i *)out, vecA);
                out += advanceA;
                _mm256_storeu_si256((__m256i *)out, vecB);
                out += advanceB;
            }
        }
    }
    base += i * 64;
    for (; (i < length) && (out < safeout); ++i) {
        uint64_t w = words[i];
        while ((w != 0) && (out < safeout)) {
            int r =
                roaring_trailing_zeroes(w);  // on x64, should compile to TZCNT
            uint32_t val = r + base;
            memcpy(out, &val,
                   sizeof(uint32_t));  // should be compiled as a MOV on x64
            out++;
            w &= (w - 1);
        }
        base += 64;
    }
    return out - initout;
}